

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

uchar * __thiscall MD5::MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->finished = false;
  this->count[0] = 0;
  this->count[1] = 0;
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  iVar1 = init(this,*(EVP_PKEY_CTX **)d);
  return (uchar *)CONCAT44(extraout_var,iVar1);
}

Assistant:

MD5::MD5(const std::string& message) {
  finished = false;
  /* Reset number of bits. */
  count[0] = count[1] = 0;
  /* Initialization constants. */
  state[0] = 0x67452301;
  state[1] = 0xefcdab89;
  state[2] = 0x98badcfe;
  state[3] = 0x10325476;

  /* Initialization the object according to message. */
  init((const byte*)message.c_str(), message.length());
}